

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void __thiscall TestRunner::TestRunner(TestRunner *this,char *ts_name)

{
  FILE *pFVar1;
  allocator<char> local_29;
  string filename;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&filename,ts_name,&local_29);
  std::__cxx11::string::rfind((char *)&filename,0x1060ca);
  std::__cxx11::string::erase((ulong)&filename,0);
  std::__cxx11::string::append((char *)&filename);
  pFVar1 = fopen(filename._M_dataplus._M_p,"w+");
  logging_set_file(pFVar1);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

TestRunner( const char *ts_name )
	{
		std::string filename( ts_name );
		std::string::size_type i = filename.rfind( "/" );
		filename.erase( 0, i + 1 );
		filename += ".log";	
		//printf( "logging to file %s\n", filename.c_str() );
		FILE *log_file = fopen( filename.c_str(), "w+" );
		logging_set_file( log_file );
	}